

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O0

void __thiscall Order_product_Test::~Order_product_Test(Order_product_Test *this)

{
  Order_product_Test *this_local;
  
  ~Order_product_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Order, product)
{
    auto const a = symbol("a");
    auto const b = symbol("b");
    auto const c = symbol("c");
    auto const d = symbol("d");
    EXPECT_TRUE(less(a * b, a * c));
    EXPECT_TRUE(less(a * c * d, b * c * d));
}